

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_stop_in_cb(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  char path [24];
  uv_timer_t timer;
  uv_fs_event_t fs;
  
  builtin_strncpy(path,"fs_event_stop_in_cb.txt",0x18);
  remove(path);
  create_file(path);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(uVar2,&fs);
  timer.data = (void *)(long)iVar1;
  if (timer.data == (void *)0x0) {
    iVar1 = uv_fs_event_start(&fs,fs_event_cb_stop,path,0);
    timer.data = (void *)(long)iVar1;
    if (timer.data == (void *)0x0) {
      timer.data = path;
      uVar2 = uv_default_loop();
      iVar1 = uv_timer_init(uVar2,&timer);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_timer_start(&timer,timer_cb_touch,100,0);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          eval_b = (int64_t)fs_event_cb_stop_calls;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            eval_b = (int64_t)timer_cb_touch_called;
            eval_b_2 = 0;
            if ((void *)eval_b == (void *)0x0) {
              uVar2 = uv_default_loop();
              iVar1 = uv_run(uVar2,0);
              eval_b = (int64_t)iVar1;
              eval_b_2 = 0;
              if ((void *)eval_b == (void *)0x0) {
                eval_b = 1;
                eval_b_2 = (int64_t)fs_event_cb_stop_calls;
                if (eval_b_2 == 1) {
                  eval_b = 1;
                  eval_b_2 = (int64_t)timer_cb_touch_called;
                  if (eval_b_2 == 1) {
                    uv_close(&fs,0);
                    uVar2 = uv_default_loop();
                    iVar1 = uv_run(uVar2,0);
                    eval_b = (int64_t)iVar1;
                    eval_b_2 = 0;
                    if ((void *)eval_b == (void *)0x0) {
                      eval_b = 1;
                      eval_b_2 = (int64_t)fs_event_cb_stop_calls;
                      if (eval_b_2 == 1) {
                        remove(path);
                        loop = (uv_loop_t *)uv_default_loop();
                        close_loop(loop);
                        eval_b = 0;
                        uVar2 = uv_default_loop();
                        iVar1 = uv_loop_close(uVar2);
                        eval_b_2 = (int64_t)iVar1;
                        if (eval_b_2 == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar4 = "uv_loop_close(uv_default_loop())";
                        pcVar3 = "0";
                        uVar2 = 0x4dc;
                      }
                      else {
                        pcVar4 = "fs_event_cb_stop_calls";
                        pcVar3 = "1";
                        uVar2 = 0x4d8;
                      }
                    }
                    else {
                      pcVar4 = "0";
                      pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                      uVar2 = 0x4d7;
                    }
                  }
                  else {
                    pcVar4 = "timer_cb_touch_called";
                    pcVar3 = "1";
                    uVar2 = 0x4d4;
                  }
                }
                else {
                  pcVar4 = "fs_event_cb_stop_calls";
                  pcVar3 = "1";
                  uVar2 = 0x4d3;
                }
              }
              else {
                pcVar4 = "0";
                pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
                uVar2 = 0x4d1;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "timer_cb_touch_called";
              uVar2 = 0x4cf;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "fs_event_cb_stop_calls";
            uVar2 = 0x4ce;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_timer_start(&timer, timer_cb_touch, 100, 0)";
          uVar2 = 0x4cc;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_timer_init(uv_default_loop(), &timer)";
        uVar2 = 0x4cb;
      }
      goto LAB_00123008;
    }
    pcVar3 = "uv_fs_event_start(&fs, fs_event_cb_stop, path, 0)";
    uVar2 = 0x4c7;
  }
  else {
    pcVar3 = "uv_fs_event_init(uv_default_loop(), &fs)";
    uVar2 = 0x4c6;
  }
  pcVar4 = "0";
  eval_b_2 = 0;
  eval_b = (int64_t)timer.data;
LAB_00123008:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(fs_event_stop_in_cb) {
  uv_fs_event_t fs;
  uv_timer_t timer;
  char path[] = "fs_event_stop_in_cb.txt";

#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  remove(path);
  create_file(path);

  ASSERT_OK(uv_fs_event_init(uv_default_loop(), &fs));
  ASSERT_OK(uv_fs_event_start(&fs, fs_event_cb_stop, path, 0));

  /* Note: timer_cb_touch() closes the handle. */
  timer.data = path;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_touch, 100, 0));

  ASSERT_OK(fs_event_cb_stop_calls);
  ASSERT_OK(timer_cb_touch_called);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, fs_event_cb_stop_calls);
  ASSERT_EQ(1, timer_cb_touch_called);

  uv_close((uv_handle_t*) &fs, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, fs_event_cb_stop_calls);

  remove(path);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}